

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupTrimmed(Gia_Man_t *p,int fTrimCis,int fTrimCos,int fDualOut,int OutValue)

{
  char *pcVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *__ptr;
  Gia_Man_t *p_00;
  size_t sVar5;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  Gia_Man_t *pGVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  undefined8 uVar18;
  long lVar19;
  bool bVar20;
  
  if (fTrimCos == 0 || fDualOut == 0) {
    __ptr = (Vec_Int_t *)0x0;
  }
  else {
    __ptr = Gia_ManDupTrimmedNonZero(p);
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar1);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar1);
  }
  p_00->pName = pcVar6;
  pcVar1 = p->pSpec;
  uVar16 = 0;
  if (pcVar1 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar1);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar1);
  }
  p_00->pSpec = pcVar6;
  Gia_ManCreateRefs(p);
  uVar11 = p->vCis->nSize;
  uVar3 = uVar11 - p->nRegs;
  if (uVar3 == 0 || (int)uVar11 < p->nRegs) {
LAB_001e53e5:
    if ((uint)uVar16 != uVar3) goto LAB_001e5488;
  }
  else {
    uVar16 = 0;
    uVar13 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      uVar13 = uVar16;
    }
    do {
      if (uVar13 == uVar16) goto LAB_001e5ab7;
      iVar4 = p->vCis->pArray[uVar16];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_001e5a5a;
      if ((fTrimCis == 0) || ((p->pObjs == (Gia_Obj_t *)0x0 || (p->pRefs[iVar4] != 0))))
      goto LAB_001e53e5;
      uVar16 = uVar16 + 1;
    } while (uVar3 != uVar16);
  }
  pGVar7 = Gia_ManAppendObj(p_00);
  uVar16 = *(ulong *)pGVar7;
  *(ulong *)pGVar7 = uVar16 | 0x9fffffff;
  *(ulong *)pGVar7 =
       uVar16 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
  pGVar2 = p_00->pObjs;
  if ((pGVar2 <= pGVar7) && (pGVar7 < pGVar2 + p_00->nObjs)) {
    Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * -0x55555555);
    if ((p_00->pObjs <= pGVar7) && (pGVar7 < p_00->pObjs + p_00->nObjs)) {
LAB_001e5488:
      pGVar10 = p;
      Gia_ManFillValue(p);
      p->pObjs->Value = 0;
      pVVar9 = p->vCis;
      uVar16 = (ulong)(uint)pVVar9->nSize;
      if (0 < pVVar9->nSize) {
        lVar19 = 0;
        do {
          lVar12 = (long)pVVar9->pArray[lVar19];
          if ((lVar12 < 0) || (p->nObjs <= pVVar9->pArray[lVar19])) goto LAB_001e5a5a;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar2 = p->pObjs + lVar12;
          if ((fTrimCis == 0) || (p->pRefs[lVar12] != 0)) {
LAB_001e54f3:
            pGVar8 = Gia_ManAppendObj(p_00);
            uVar16 = *(ulong *)pGVar8;
            *(ulong *)pGVar8 = uVar16 | 0x9fffffff;
            *(ulong *)pGVar8 =
                 uVar16 & 0xe0000000ffffffff | 0x9fffffff |
                 (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
            pGVar7 = p_00->pObjs;
            if ((pGVar8 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar8)) goto LAB_001e5a98;
            pGVar10 = (Gia_Man_t *)p_00->vCis;
            Vec_IntPush((Vec_Int_t *)pGVar10,
                        (int)((ulong)((long)pGVar8 - (long)pGVar7) >> 2) * -0x55555555);
            pGVar7 = p_00->pObjs;
            if ((pGVar8 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar8)) goto LAB_001e5a98;
            pGVar2->Value = (int)((ulong)((long)pGVar8 - (long)pGVar7) >> 2) * 0x55555556;
            pVVar9 = p->vCis;
          }
          else {
            uVar18 = *(undefined8 *)pGVar2;
            pGVar10 = (Gia_Man_t *)0x9fffffff;
            if ((((uint)uVar18 & 0x9fffffff) == 0x9fffffff) &&
               ((int)uVar16 - p->nRegs <= (int)((uint)((ulong)uVar18 >> 0x20) & 0x1fffffff)))
            goto LAB_001e54f3;
          }
          lVar19 = lVar19 + 1;
          uVar16 = (ulong)pVVar9->nSize;
        } while (lVar19 < (long)uVar16);
      }
      iVar4 = p->nObjs;
      if (0 < iVar4) {
        lVar19 = 8;
        lVar12 = 0;
        do {
          pGVar2 = p->pObjs;
          if (pGVar2 == (Gia_Obj_t *)0x0) break;
          uVar16 = *(ulong *)((long)pGVar2 + lVar19 + -8);
          bVar20 = (int)uVar16 < 0;
          uVar13 = uVar16 & 0x1fffffff;
          pGVar10 = (Gia_Man_t *)
                    CONCAT71((int7)((ulong)pGVar10 >> 8),uVar13 == 0x1fffffff || bVar20);
          if (uVar13 != 0x1fffffff && !bVar20) {
            uVar11 = *(uint *)((long)pGVar2 + lVar19 + (ulong)(uint)((int)uVar13 << 2) * -3);
            if (((int)uVar11 < 0) ||
               (uVar3 = *(uint *)((long)pGVar2 +
                                 lVar19 + (ulong)((uint)(uVar16 >> 0x1e) & 0x7ffffffc) * -3),
               (int)uVar3 < 0)) goto LAB_001e5a79;
            pGVar10 = p_00;
            iVar4 = Gia_ManAppendAnd(p_00,uVar11 ^ (uint)(uVar16 >> 0x1d) & 1,
                                     uVar3 ^ (uint)(uVar16 >> 0x3d) & 1);
            *(int *)(&pGVar2->field_0x0 + lVar19) = iVar4;
            iVar4 = p->nObjs;
          }
          lVar12 = lVar12 + 1;
          lVar19 = lVar19 + 0xc;
        } while (lVar12 < iVar4);
      }
      if (fTrimCos == 0 || fDualOut == 0) {
        iVar4 = p->nRegs;
        pVVar9 = p->vCos;
        iVar14 = pVVar9->nSize;
        iVar15 = 0;
        if (iVar4 < iVar14) {
          lVar19 = 0;
          do {
            if (iVar14 <= lVar19) goto LAB_001e5ab7;
            iVar14 = pVVar9->pArray[lVar19];
            if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) goto LAB_001e5a5a;
            if ((fTrimCos == 0) || (p->pObjs == (Gia_Obj_t *)0x0)) break;
            iVar14 = Gia_ManPoIsToRemove(pGVar10,p->pObjs + iVar14,OutValue);
            iVar4 = p->nRegs;
            pVVar9 = p->vCos;
            if (iVar14 == 0) break;
            lVar19 = lVar19 + 1;
            iVar14 = pVVar9->nSize;
          } while (lVar19 < iVar14 - iVar4);
          iVar15 = (int)lVar19;
          iVar14 = pVVar9->nSize;
        }
        if (iVar15 == iVar14 - iVar4) {
          pGVar10 = p_00;
          Gia_ManAppendCo(p_00,0);
          pVVar9 = p->vCos;
          iVar14 = pVVar9->nSize;
        }
        if (0 < iVar14) {
          lVar19 = 0;
          do {
            iVar4 = pVVar9->pArray[lVar19];
            if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_001e5a5a;
            if (p->pObjs == (Gia_Obj_t *)0x0) break;
            pGVar2 = p->pObjs + iVar4;
            if (fTrimCos == 0) {
              uVar18 = *(undefined8 *)pGVar2;
LAB_001e59d1:
              if ((int)pGVar2[-(ulong)((uint)uVar18 & 0x1fffffff)].Value < 0) goto LAB_001e5a79;
              pGVar10 = p_00;
              Gia_ManAppendCo(p_00,(uint)uVar18 >> 0x1d & 1 ^
                                   pGVar2[-(ulong)((uint)uVar18 & 0x1fffffff)].Value);
              pVVar9 = p->vCos;
            }
            else {
              iVar4 = Gia_ManPoIsToRemove(pGVar10,pGVar2,OutValue);
              uVar18 = *(undefined8 *)pGVar2;
              if ((iVar4 == 0) ||
                 ((pVVar9 = p->vCos, (~(uint)uVar18 & 0x1fffffff) != 0 && (int)(uint)uVar18 < 0 &&
                  (pVVar9->nSize - p->nRegs <= (int)((uint)((ulong)uVar18 >> 0x20) & 0x1fffffff)))))
              goto LAB_001e59d1;
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 < pVVar9->nSize);
        }
        Gia_ManSetRegNum(p_00,p->nRegs);
      }
      else {
        if (0 < __ptr->nSize) {
          lVar19 = 0;
          do {
            iVar4 = __ptr->pArray[lVar19];
            uVar3 = iVar4 * 2;
            uVar11 = p->vCos->nSize;
            uVar17 = uVar11 - p->nRegs;
            if (uVar17 == uVar3 || SBORROW4(uVar17,uVar3) != (int)(uVar17 + iVar4 * -2) < 0) {
LAB_001e5ad6:
              __assert_fail("v < Gia_ManPoNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
            }
            if ((iVar4 < 0) ||
               (uVar11 == uVar3 || SBORROW4(uVar11,uVar3) != (int)(uVar11 + iVar4 * -2) < 0))
            goto LAB_001e5ab7;
            iVar4 = p->vCos->pArray[uVar3];
            if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_001e5a5a;
            uVar17 = (uint)*(undefined8 *)(p->pObjs + iVar4);
            uVar11 = (p->pObjs + iVar4)[-(ulong)(uVar17 & 0x1fffffff)].Value;
            if ((int)uVar11 < 0) goto LAB_001e5a79;
            Gia_ManAppendCo(p_00,uVar17 >> 0x1d & 1 ^ uVar11);
            uVar3 = uVar3 | 1;
            iVar4 = p->vCos->nSize;
            if (iVar4 - p->nRegs <= (int)uVar3) goto LAB_001e5ad6;
            if (iVar4 <= (int)uVar3) goto LAB_001e5ab7;
            iVar4 = p->vCos->pArray[uVar3];
            if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_001e5a5a;
            uVar3 = (uint)*(undefined8 *)(p->pObjs + iVar4);
            uVar11 = (p->pObjs + iVar4)[-(ulong)(uVar3 & 0x1fffffff)].Value;
            if ((int)uVar11 < 0) goto LAB_001e5a79;
            Gia_ManAppendCo(p_00,uVar3 >> 0x1d & 1 ^ uVar11);
            lVar19 = lVar19 + 1;
          } while (lVar19 < __ptr->nSize);
        }
        if (p_00->vCos->nSize == p_00->nRegs) {
          Gia_ManAppendCo(p_00,0);
          Gia_ManAppendCo(p_00,0);
        }
        iVar4 = p->nRegs;
        if (0 < iVar4) {
          iVar14 = 0;
          do {
            iVar15 = p->vCos->nSize;
            uVar11 = (iVar15 - iVar4) + iVar14;
            if (((int)uVar11 < 0) || (iVar15 <= (int)uVar11)) {
LAB_001e5ab7:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar15 = p->vCos->pArray[uVar11];
            if (((long)iVar15 < 0) || (p->nObjs <= iVar15)) {
LAB_001e5a5a:
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            if (p->pObjs == (Gia_Obj_t *)0x0) break;
            pGVar2 = p->pObjs + iVar15;
            uVar3 = (uint)*(undefined8 *)pGVar2;
            uVar11 = pGVar2[-(ulong)(uVar3 & 0x1fffffff)].Value;
            if ((int)uVar11 < 0) {
LAB_001e5a79:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x132,"int Abc_LitNotCond(int, int)");
            }
            Gia_ManAppendCo(p_00,uVar3 >> 0x1d & 1 ^ uVar11);
            iVar14 = iVar14 + 1;
            iVar4 = p->nRegs;
          } while (iVar14 < iVar4);
        }
        Gia_ManSetRegNum(p_00,iVar4);
        pGVar10 = Gia_ManSeqStructSweep(p_00,1,1,0);
        Gia_ManStop(p_00);
        p_00 = pGVar10;
      }
      if (__ptr != (Vec_Int_t *)0x0) {
        if (__ptr->pArray != (int *)0x0) {
          free(__ptr->pArray);
        }
        free(__ptr);
      }
      iVar4 = Gia_ManHasDangling(p_00);
      if (iVar4 != 0) {
        __assert_fail("!Gia_ManHasDangling( pNew )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                      ,0x8c2,"Gia_Man_t *Gia_ManDupTrimmed(Gia_Man_t *, int, int, int, int)");
      }
      return p_00;
    }
  }
LAB_001e5a98:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

Gia_Man_t * Gia_ManDupTrimmed( Gia_Man_t * p, int fTrimCis, int fTrimCos, int fDualOut, int OutValue )
{
    Vec_Int_t * vNonZero = NULL;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, Entry;
    // collect non-zero
    if ( fDualOut && fTrimCos )
        vNonZero = Gia_ManDupTrimmedNonZero( p );
    // start new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // check if there are PIs to be added
    Gia_ManCreateRefs( p );
    Gia_ManForEachPi( p, pObj, i )
        if ( !fTrimCis || Gia_ObjRefNum(p, pObj) )
            break;
    if ( i == Gia_ManPiNum(p) ) // there is no PIs - add dummy PI
        Gia_ManAppendCi(pNew);
    // add the ROs
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        if ( !fTrimCis || Gia_ObjRefNum(p, pObj) || Gia_ObjIsRo(p, pObj) )
            pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    if ( fDualOut && fTrimCos )
    {
        Vec_IntForEachEntry( vNonZero, Entry, i )
        {
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ManPo(p, 2*Entry+0)) );
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ManPo(p, 2*Entry+1)) );
        }
        if ( Gia_ManPoNum(pNew) == 0 ) // nothing - add dummy PO
        {
//            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ManPo(p, 0)) );
//            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ManPo(p, 1)) );
            Gia_ManAppendCo( pNew, 0 );
            Gia_ManAppendCo( pNew, 0 );
        }
        Gia_ManForEachRi( p, pObj, i )
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
        // cleanup
        pNew = Gia_ManSeqStructSweep( pTemp = pNew, 1, 1, 0 );
        Gia_ManStop( pTemp );
        // trim the PIs
//        pNew = Gia_ManDupTrimmed( pTemp = pNew, 1, 0, 0 );
//        Gia_ManStop( pTemp );
    }
    else
    {
        // check if there are POs to be added
        Gia_ManForEachPo( p, pObj, i )
            if ( !fTrimCos || !Gia_ManPoIsToRemove(p, pObj, OutValue) )
                break;
        if ( i == Gia_ManPoNum(p) ) // there is no POs - add dummy PO
            Gia_ManAppendCo( pNew, 0 );
        Gia_ManForEachCo( p, pObj, i )
            if ( !fTrimCos || !Gia_ManPoIsToRemove(p, pObj, OutValue) || Gia_ObjIsRi(p, pObj) )
                Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    }
    Vec_IntFreeP( &vNonZero );
    assert( !Gia_ManHasDangling( pNew ) );
    return pNew;
}